

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__decode_half_float_linear_BGRA(float *decodep,int width_times_channels,void *inputp)

{
  undefined1 (*pauVar1) [16];
  float fVar2;
  undefined1 auVar3 [16];
  float fVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 (*pauVar8) [16];
  short *psVar9;
  float *decode;
  undefined1 (*pauVar10) [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  undefined2 uVar20;
  undefined2 uVar21;
  int iVar22;
  ushort uVar23;
  int iVar24;
  undefined2 uVar25;
  undefined2 uVar26;
  undefined2 uVar28;
  undefined1 auVar15 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar27;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  auVar7 = _DAT_00195350;
  auVar6 = _DAT_001890a0;
  pauVar1 = (undefined1 (*) [16])(decodep + width_times_channels);
  if (width_times_channels < 8) {
    if (3 < width_times_channels) {
      pauVar8 = (undefined1 (*) [16])(decodep + 4);
      psVar9 = (short *)((long)inputp + 6);
      do {
        fVar11 = (float)(((int)psVar9[-1] & 0x7fffU) << 0xd) * 5.192297e+33;
        fVar2 = (float)((uint)fVar11 | 0x7f800000);
        if (fVar11 < 65536.0) {
          fVar2 = fVar11;
        }
        *(uint *)pauVar8[-1] = (int)psVar9[-1] & 0x80000000U | (uint)fVar2;
        fVar11 = (float)(((int)psVar9[-2] & 0x7fffU) << 0xd) * 5.192297e+33;
        fVar2 = (float)((uint)fVar11 | 0x7f800000);
        if (fVar11 < 65536.0) {
          fVar2 = fVar11;
        }
        *(uint *)((long)pauVar8[-1] + 4) = (int)psVar9[-2] & 0x80000000U | (uint)fVar2;
        fVar11 = (float)(((int)psVar9[-3] & 0x7fffU) << 0xd) * 5.192297e+33;
        fVar2 = (float)((uint)fVar11 | 0x7f800000);
        if (fVar11 < 65536.0) {
          fVar2 = fVar11;
        }
        *(uint *)((long)pauVar8[-1] + 8) = (int)psVar9[-3] & 0x80000000U | (uint)fVar2;
        fVar11 = (float)(((int)*psVar9 & 0x7fffU) << 0xd) * 5.192297e+33;
        fVar2 = (float)((uint)fVar11 | 0x7f800000);
        if (fVar11 < 65536.0) {
          fVar2 = fVar11;
        }
        *(uint *)((long)pauVar8[-1] + 0xc) = (int)*psVar9 & 0x80000000U | (uint)fVar2;
        pauVar8 = pauVar8 + 1;
        psVar9 = psVar9 + 4;
      } while (pauVar8 <= pauVar1);
    }
  }
  else {
    pauVar8 = (undefined1 (*) [16])inputp;
    do {
      do {
        auVar12 = *pauVar8;
        uVar21 = auVar12._4_2_;
        auVar5._10_2_ = uVar21;
        auVar5._0_10_ = (unkuint10)0;
        uVar20 = auVar12._2_2_;
        auVar18._0_2_ = auVar12._0_2_;
        auVar3._2_12_ = SUB1612(ZEXT616(CONCAT42(auVar5._8_4_,uVar20)) << 0x30,4);
        auVar3._0_2_ = auVar18._0_2_;
        auVar3._14_2_ = 0;
        uVar23 = auVar12._8_2_;
        uVar25 = auVar12._10_2_;
        auVar30._0_10_ = (unkuint10)CONCAT24(uVar25,(uint)uVar23) << 0x10;
        uVar26 = auVar12._12_2_;
        auVar30._10_2_ = uVar26;
        auVar30._12_2_ = 0;
        uVar28 = auVar12._14_2_;
        auVar30._14_2_ = uVar28;
        auVar17._0_12_ = auVar12._0_12_;
        auVar17._12_2_ = auVar12._6_2_;
        auVar17._14_2_ = auVar12._6_2_;
        auVar16._12_4_ = auVar17._12_4_;
        auVar16._0_10_ = auVar12._0_10_;
        auVar16._10_2_ = uVar21;
        auVar15._10_6_ = auVar16._10_6_;
        auVar15._0_8_ = auVar12._0_8_;
        auVar15._8_2_ = uVar21;
        auVar18._8_8_ = auVar15._8_8_;
        auVar18._6_2_ = uVar20;
        auVar18._4_2_ = uVar20;
        auVar18._2_2_ = auVar18._0_2_;
        auVar18 = auVar18 & auVar7;
        iVar14 = auVar18._0_4_;
        iVar22 = auVar18._4_4_;
        iVar24 = auVar18._8_4_;
        iVar27 = auVar18._12_4_;
        auVar19._0_4_ = iVar14 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar14) & 0x38000000);
        auVar19._4_4_ = iVar22 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar22) & 0x38000000);
        auVar19._8_4_ = iVar24 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar24) & 0x38000000);
        auVar19._12_4_ = iVar27 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar27) & 0x38000000);
        auVar32._0_4_ = -(uint)(0x3ff < iVar14);
        auVar32._4_4_ = -(uint)(0x3ff < iVar22);
        auVar32._8_4_ = -(uint)(0x3ff < iVar24);
        auVar32._12_4_ = -(uint)(0x3ff < iVar27);
        auVar33._0_4_ = (float)(iVar14 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar33._4_4_ = (float)(iVar22 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar33._8_4_ = (float)(iVar24 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar33._12_4_ = (float)(iVar27 * 0x2000 + 0x38800000) + -6.1035156e-05;
        *(undefined1 (*) [16])decodep =
             auVar3 << 0x10 & auVar6 | auVar19 & auVar32 | ~auVar32 & auVar33;
        auVar12._2_2_ = uVar23;
        auVar12._0_2_ = uVar23;
        auVar12._4_2_ = uVar25;
        auVar12._6_2_ = uVar25;
        auVar12._8_2_ = uVar26;
        auVar12._10_2_ = uVar26;
        auVar12._12_2_ = uVar28;
        auVar12._14_2_ = uVar28;
        auVar12 = auVar12 & auVar7;
        iVar14 = auVar12._0_4_;
        iVar22 = auVar12._4_4_;
        iVar24 = auVar12._8_4_;
        iVar27 = auVar12._12_4_;
        auVar29._0_4_ = -(uint)(0x3ff < iVar14);
        auVar29._4_4_ = -(uint)(0x3ff < iVar22);
        auVar29._8_4_ = -(uint)(0x3ff < iVar24);
        auVar29._12_4_ = -(uint)(0x3ff < iVar27);
        auVar13._0_4_ = iVar14 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar14) & 0x38000000);
        auVar13._4_4_ = iVar22 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar22) & 0x38000000);
        auVar13._8_4_ = iVar24 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar24) & 0x38000000);
        auVar13._12_4_ = iVar27 * 0x2000 + 0x38000000 + (-(uint)(0x7bff < iVar27) & 0x38000000);
        auVar31._0_4_ = (float)(iVar14 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar31._4_4_ = (float)(iVar22 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar31._8_4_ = (float)(iVar24 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar31._12_4_ = (float)(iVar27 * 0x2000 + 0x38800000) + -6.1035156e-05;
        auVar12 = auVar30 & auVar6 | auVar13 & auVar29 | ~auVar29 & auVar31;
        fVar2 = *(float *)*(undefined1 (*) [16])decodep;
        fVar11 = *(float *)((long)*(undefined1 (*) [16])decodep + 4);
        fVar4 = *(float *)((long)*(undefined1 (*) [16])decodep + 0xc);
        *(float *)*(undefined1 (*) [16])decodep =
             *(float *)((long)*(undefined1 (*) [16])decodep + 8);
        *(float *)((long)*(undefined1 (*) [16])decodep + 4) = fVar11;
        *(float *)((long)*(undefined1 (*) [16])decodep + 8) = fVar2;
        *(float *)((long)*(undefined1 (*) [16])decodep + 0xc) = fVar4;
        *(float *)*(undefined1 (*) [16])((long)decodep + 0x10) = auVar12._8_4_;
        *(float *)((long)*(undefined1 (*) [16])((long)decodep + 0x10) + 4) = auVar12._4_4_;
        *(float *)((long)*(undefined1 (*) [16])((long)decodep + 0x10) + 8) = auVar12._0_4_;
        *(float *)((long)*(undefined1 (*) [16])((long)decodep + 0x10) + 0xc) = auVar12._12_4_;
        pauVar10 = (undefined1 (*) [16])((long)decodep + 0x20);
        pauVar8 = pauVar8 + 1;
        decodep = (float *)pauVar10;
      } while (pauVar10 <= pauVar1 + -2);
      pauVar8 = (undefined1 (*) [16])((long)inputp + (long)width_times_channels * 2 + -0x10);
      decodep = (float *)(pauVar1 + -2);
    } while (pauVar10 != pauVar1);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_half_float_linear)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  stbir__FP16 const * input = (stbir__FP16 const *)inputp;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= 8 )
  {
    stbir__FP16 const * end_input_m8 = input + width_times_channels - 8;
    decode_end -= 8;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      STBIR_NO_UNROLL(decode);

      stbir__half_to_float_SIMD( decode, input );
      #ifdef stbir__decode_swizzle
      #ifdef STBIR_SIMD8
      {
        stbir__simdf8 of;
        stbir__simdf8_load( of, decode );
        stbir__decode_simdf8_flip( of );
        stbir__simdf8_store( decode, of );
      }
      #else
      {
        stbir__simdf of0,of1;
        stbir__simdf_load( of0, decode );
        stbir__simdf_load( of1, decode+4 );
        stbir__decode_simdf4_flip( of0 );
        stbir__decode_simdf4_flip( of1 );
        stbir__simdf_store( decode, of0 );
        stbir__simdf_store( decode+4, of1 );
      }
      #endif
      #endif
      decode += 8;
      input += 8;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 8 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = stbir__half_to_float(input[stbir__decode_order0]);
    decode[1-4] = stbir__half_to_float(input[stbir__decode_order1]);
    decode[2-4] = stbir__half_to_float(input[stbir__decode_order2]);
    decode[3-4] = stbir__half_to_float(input[stbir__decode_order3]);
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = stbir__half_to_float(input[stbir__decode_order0]);
    #if stbir__coder_min_num >= 2
    decode[1] = stbir__half_to_float(input[stbir__decode_order1]);
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = stbir__half_to_float(input[stbir__decode_order2]);
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}